

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_arg.c
# Opt level: O2

err_t cmdArgCreate(int *argc,char ***argv,char *args)

{
  int iVar1;
  size_t sVar2;
  char **ppcVar3;
  ulong uVar4;
  err_t eVar5;
  long lVar6;
  size_t sVar7;
  long lVar8;
  wordexp_t we [1];
  
  iVar1 = wordexp(args,(wordexp_t *)we,0);
  eVar5 = 0x6e;
  if (iVar1 == 0) {
    *argv = (char **)0x0;
    iVar1 = (int)we[0].we_wordc;
    *argc = iVar1;
    if (iVar1 != 0) {
      sVar7 = (long)iVar1 << 3;
      for (lVar6 = 0; lVar6 < (int)we[0].we_wordc; lVar6 = lVar6 + 1) {
        sVar2 = strLen(we[0].we_wordv[lVar6]);
        sVar7 = sVar7 + sVar2 + 1;
        we[0].we_wordc = (size_t)(uint)*argc;
      }
      ppcVar3 = (char **)blobCreate(sVar7);
      *argv = ppcVar3;
      if (ppcVar3 == (char **)0x0) {
        wordfree((wordexp_t *)we);
        return 0x6e;
      }
      uVar4 = (ulong)*argc;
      lVar8 = uVar4 << 3;
      for (lVar6 = 0; lVar6 < (int)uVar4; lVar6 = lVar6 + 1) {
        (*argv)[lVar6] = (char *)((long)*argv + lVar8);
        strCopy((*argv)[lVar6],we[0].we_wordv[lVar6]);
        sVar7 = strLen((*argv)[lVar6]);
        lVar8 = lVar8 + sVar7 + 1;
        uVar4 = (ulong)(uint)*argc;
      }
    }
    wordfree((wordexp_t *)we);
    eVar5 = 0;
  }
  else if (iVar1 != 1) {
    eVar5 = 0x25b;
  }
  return eVar5;
}

Assistant:

err_t cmdArgCreate(int* argc, char*** argv, const char* args)
{
	wordexp_t we[1];
	size_t count;
	int pos;
	// входной контроль
	ASSERT(strIsValid(args));
	ASSERT(memIsDisjoint2(argc, sizeof(int), argv, sizeof(char**)));
	// разбить args на строки широких символов
	switch (wordexp(args, we, 0))
	{
	case 0:
		break;
	case WRDE_NOSPACE:
		return ERR_OUTOFMEMORY;
	default:
		return ERR_CMD_PARAMS;
	}
	*argv = 0, *argc = we->we_wordc;
	// обработать отсутствие аргументов
	if (*argc == 0)
	{
		wordfree(we);
		return ERR_OK;
	}
	// перенести аргументы в блоб
	count = (size_t)(*argc) * sizeof(char*);
	for (pos = 0; pos < *argc; ++pos)
		count += strLen(we->we_wordv[pos]) + 1;
	if (!(*argv = blobCreate(count)))
	{
		wordfree(we);
		return ERR_OUTOFMEMORY;
	}
	count = (size_t)(*argc) * sizeof(char*);
	for (pos = 0; pos < *argc; ++pos)
	{
		(*argv)[pos] = (char*)*argv + count;
		strCopy((*argv)[pos], we->we_wordv[pos]);
		count += strLen((*argv)[pos]) + 1;
	}
	// завершить
	wordfree(we);
	return ERR_OK;
}